

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O0

void raviX_ptrlist_iter_split_current(PtrListIterator *self)

{
  PtrListIterator *self_local;
  
  if (((short)(char)*(undefined2 *)self->__list == N_) &&
     (raviX_ptrlist_split_node(self->__list),
     (int)(short)(char)*(undefined2 *)self->__list <= self->__nr)) {
    self->__nr = self->__nr - (int)(short)(char)*(undefined2 *)self->__list;
    self->__list = self->__list->next_;
  }
  return;
}

Assistant:

void raviX_ptrlist_iter_split_current(PtrListIterator *self)
{
	if (self->__list->nr_ == N_) {
		/* full so split */
		raviX_ptrlist_split_node(self->__list);
		if (self->__nr >= self->__list->nr_) {
			self->__nr -= self->__list->nr_;
			self->__list = self->__list->next_;
		}
	}
}